

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MomentumHistogram.cpp
# Opt level: O1

ssize_t __thiscall
OpenMD::MomentumHistogram::write(MomentumHistogram *this,int __fd,void *__buf,size_t __n)

{
  char cVar1;
  ostream *poVar2;
  ssize_t sVar3;
  uint uVar4;
  ulong uVar5;
  ofstream rdfStream;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream
            (&local_230,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    snprintf(painCave.errMsg,2000,"MomentumHistogram: unable to open %s\n",
             (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#",1);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(this->momentumLabel_)._M_dataplus._M_p,
                        (this->momentumLabel_)._M_string_length);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(this->componentLabel_)._M_dataplus._M_p,
                        (this->componentLabel_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," distribtution \n",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# nFrames:\t",0xb);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&local_230,this->nProcessed_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# selection: (",0xe);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(this->selectionScript_)._M_dataplus._M_p,
                        (this->selectionScript_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"Bin_center",10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\tcount\n",7);
    if ((this->histList_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->histList_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar4 = 1;
      uVar5 = 0;
      do {
        poVar2 = std::ostream::_M_insert<double>
                           ((this->bincenter_).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar5]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
        poVar2 = std::ostream::_M_insert<double>
                           ((this->histList_).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar5]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
        uVar5 = (ulong)uVar4;
        uVar4 = uVar4 + 1;
      } while (uVar5 < (ulong)((long)(this->histList_).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)(this->histList_).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start >> 3));
    }
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_228);
  sVar3 = std::ios_base::~ios_base(local_138);
  return sVar3;
}

Assistant:

void MomentumHistogram::write() {
    std::ofstream rdfStream(outputFilename_.c_str());
    if (rdfStream.is_open()) {
      rdfStream << "#" << momentumLabel_ << componentLabel_
                << " distribtution \n";
      rdfStream << "# nFrames:\t" << nProcessed_ << "\n";
      rdfStream << "# selection: (" << selectionScript_ << ")\n";
      rdfStream << "# "
                << "Bin_center"
                << "\tcount\n";
      for (unsigned int i = 0; i < histList_.size(); ++i) {
        rdfStream << bincenter_[i] << "\t" << histList_[i] << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "MomentumHistogram: unable to open %s\n",
               outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }
    rdfStream.close();
  }